

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mapper004.cpp
# Opt level: O2

void __thiscall Mapper004::handleScanline(Mapper004 *this)

{
  uint8_t uVar1;
  Console *this_00;
  CPU *this_01;
  
  if (this->counter == '\0') {
    this->counter = this->reloadVal;
    return;
  }
  uVar1 = this->counter + 0xff;
  this->counter = uVar1;
  if ((uVar1 == '\0') && (this->irqEnabled == true)) {
    this_00 = Console::Instance();
    this_01 = Console::getCPU(this_00);
    CPU::IRQ(this_01);
    return;
  }
  return;
}

Assistant:

void Mapper004::handleScanline() {
    if (counter == 0) {
        counter = reloadVal;
    } else {
        counter--;
        if (counter == 0 && irqEnabled) {
            Console &c = Console::Instance();
            c.getCPU()->IRQ();
        }
    }
}